

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absDup.c
# Opt level: O2

void Gia_ManPrintFlopClasses(Gia_Man_t *p)

{
  Vec_Int_t *p_00;
  uint uVar1;
  uint uVar2;
  
  p_00 = p->vFlopClasses;
  if (p_00 == (Vec_Int_t *)0x0) {
    return;
  }
  if (p_00->nSize == p->nRegs) {
    uVar1 = Vec_IntCountEntry(p_00,0);
    uVar2 = Vec_IntCountEntry(p_00,1);
    printf("Flop-level abstraction:  Excluded FFs = %d  Included FFs = %d  (%.2f %%) ",
           ((double)(int)uVar2 * 100.0) / (double)(int)(uVar2 + 1 + uVar1),(ulong)uVar1,(ulong)uVar2
          );
    if ((int)(uVar2 + uVar1) < p->nRegs) {
      printf("and there are other FF classes...");
    }
    putchar(10);
    return;
  }
  puts("Gia_ManPrintFlopClasses(): The number of flop map entries differs from the number of flops."
      );
  return;
}

Assistant:

void Gia_ManPrintFlopClasses( Gia_Man_t * p )
{
    int Counter0, Counter1;
    if ( p->vFlopClasses == NULL )
        return;
    if ( Vec_IntSize(p->vFlopClasses) != Gia_ManRegNum(p) )
    {
        printf( "Gia_ManPrintFlopClasses(): The number of flop map entries differs from the number of flops.\n" );
        return;
    }
    Counter0 = Vec_IntCountEntry( p->vFlopClasses, 0 );
    Counter1 = Vec_IntCountEntry( p->vFlopClasses, 1 );
    printf( "Flop-level abstraction:  Excluded FFs = %d  Included FFs = %d  (%.2f %%) ", 
        Counter0, Counter1, 100.0*Counter1/(Counter0 + Counter1 + 1) );
    if ( Counter0 + Counter1 < Gia_ManRegNum(p) )
        printf( "and there are other FF classes..." );
    printf( "\n" );
}